

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void __thiscall Rml::DataParser::Pop(DataParser *this,Register destination)

{
  Register local_44;
  InstructionData local_40;
  
  if (this->program_stack_size < 1) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Internal parser error: Tried to pop an empty stack.",
               (allocator<char> *)&local_44);
    Error(this,(String *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    this->program_stack_size = this->program_stack_size + -1;
    local_40.instruction = Pop;
    local_44 = destination;
    Variant::Variant<int,void>(&local_40.data,(int *)&local_44);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,&local_40);
    Variant::~Variant(&local_40.data);
  }
  return;
}

Assistant:

void Pop(Register destination)
	{
		if (program_stack_size <= 0)
		{
			Error("Internal parser error: Tried to pop an empty stack.");
			return;
		}
		program_stack_size -= 1;
		program.push_back(InstructionData{Instruction::Pop, Variant(int(destination))});
	}